

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O2

void check_object_curses(object *obj)

{
  curse_data *pcVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    if (z_info->curse_max == uVar2) {
      mem_free(obj->curses);
      obj->curses = (curse_data *)0x0;
      return;
    }
    pcVar1 = obj->curses + uVar2;
    uVar2 = uVar2 + 1;
  } while (pcVar1->power == L'\0');
  return;
}

Assistant:

static void check_object_curses(struct object *obj)
{
	int i;

	/* Look for a valid curse, return if one found */
	for (i = 0; i < z_info->curse_max; i++) {
		if (obj->curses[i].power) {
			return;
		}
	}

	/* Free the curse structure */
	mem_free(obj->curses);
	obj->curses = NULL;
}